

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

void __thiscall QCss::StyleSheet::buildIndexes(StyleSheet *this,CaseSensitivity nameCaseSensitivity)

{
  long lVar1;
  StyleRule *pSVar2;
  long lVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  QList<QCss::Declaration> *other;
  int iVar8;
  long lVar9;
  ulong uVar10;
  Selector *pSVar11;
  int j;
  ulong uVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<QCss::Selector> local_b8;
  QArrayDataPointer<QCss::StyleRule> local_98;
  StyleRule local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (StyleRule *)0x0;
  for (uVar10 = 0; uVar10 < (ulong)(this->styleRules).d.size; uVar10 = uVar10 + 1) {
    pSVar2 = (this->styleRules).d.ptr;
    local_b8.size = 0;
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (Selector *)0x0;
    other = &pSVar2[uVar10].declarations;
    lVar9 = 0;
    for (uVar12 = 0; iVar8 = (int)uVar10, uVar12 < (ulong)pSVar2[uVar10].selectors.d.size;
        uVar12 = uVar12 + 1) {
      pSVar11 = pSVar2[uVar10].selectors.d.ptr;
      lVar3 = *(long *)((long)&(pSVar11->basicSelectors).d.size + lVar9);
      if ((lVar3 != 0) &&
         (lVar4 = *(long *)((long)&(pSVar11->basicSelectors).d.ptr + lVar9),
         (lVar3 == 1) == (*(int *)(lVar4 + 0x60) == 0))) {
        pSVar11 = (Selector *)((long)&(pSVar11->basicSelectors).d.d + lVar9);
        lVar1 = lVar4 + lVar3 * 0x68;
        if (*(long *)(lVar4 + -0x40 + lVar3 * 0x68) == 0) {
          if (*(long *)(lVar1 + -0x58) == 0) {
            QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
                      ((QList<QCss::Selector> *)&local_b8,pSVar11);
          }
          else {
            local_78.selectors.d.d = (Data *)0x0;
            local_78.selectors.d.ptr = (Selector *)0x0;
            local_78.selectors.d.size = 0;
            local_78.declarations.d.d = (Data *)0x0;
            local_78.declarations.d.ptr = (Declaration *)0x0;
            local_78.declarations.d.size = 0;
            local_78.order = 0;
            local_78._52_4_ = 0xaaaaaaaa;
            QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>(&local_78.selectors,pSVar11);
            QArrayDataPointer<QCss::Declaration>::operator=(&local_78.declarations.d,&other->d);
            local_78.order = iVar8;
            local_d8.d = *(Data **)(lVar1 + -0x68);
            local_d8.ptr = *(char16_t **)(lVar1 + -0x60);
            local_d8.size = *(qsizetype *)(lVar1 + -0x58);
            if (local_d8.d != (Data *)0x0) {
              LOCK();
              ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            if (nameCaseSensitivity == CaseInsensitive) {
              QString::toLower_helper((QString *)&local_f8);
              qVar7 = local_d8.size;
              pcVar6 = local_d8.ptr;
              pDVar5 = local_d8.d;
              local_d8.d = local_f8.d;
              local_d8.ptr = local_f8.ptr;
              local_f8.d = pDVar5;
              local_f8.ptr = pcVar6;
              local_d8.size = local_f8.size;
              local_f8.size = qVar7;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
            }
            QMultiHash<QString,QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                      ((iterator *)&local_f8,&this->nameIndex,(QString *)&local_d8,&local_78);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
            StyleRule::~StyleRule(&local_78);
          }
        }
        else {
          local_78.selectors.d.d = (Data *)0x0;
          local_78.selectors.d.ptr = (Selector *)0x0;
          local_78.selectors.d.size = 0;
          local_78.declarations.d.d = (Data *)0x0;
          local_78.declarations.d.ptr = (Declaration *)0x0;
          local_78.declarations.d.size = 0;
          local_78.order = 0;
          local_78._52_4_ = 0xaaaaaaaa;
          QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>(&local_78.selectors,pSVar11);
          QArrayDataPointer<QCss::Declaration>::operator=(&local_78.declarations.d,&other->d);
          local_78.order = iVar8;
          QMultiHash<QString,QCss::StyleRule>::emplace<QCss::StyleRule_const&>
                    ((iterator *)&local_d8,&this->idIndex,*(QString **)(lVar1 + -0x48),&local_78);
          StyleRule::~StyleRule(&local_78);
        }
      }
      lVar9 = lVar9 + 0x18;
    }
    if (local_b8.size != 0) {
      local_78.selectors.d.d = (Data *)0x0;
      local_78.selectors.d.ptr = (Selector *)0x0;
      local_78.selectors.d.size = 0;
      local_78.declarations.d.d = (Data *)0x0;
      local_78.declarations.d.ptr = (Declaration *)0x0;
      local_78.declarations.d.size = 0;
      local_78.order = 0;
      local_78._52_4_ = 0xaaaaaaaa;
      QArrayDataPointer<QCss::Selector>::operator=
                ((QArrayDataPointer<QCss::Selector> *)&local_78,&local_b8);
      QArrayDataPointer<QCss::Declaration>::operator=(&local_78.declarations.d,&other->d);
      local_78.order = iVar8;
      QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
                ((QList<QCss::StyleRule> *)&local_98,&local_78);
      StyleRule::~StyleRule(&local_78);
    }
    QArrayDataPointer<QCss::Selector>::~QArrayDataPointer(&local_b8);
  }
  QArrayDataPointer<QCss::StyleRule>::operator=
            ((QArrayDataPointer<QCss::StyleRule> *)this,&local_98);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StyleSheet::buildIndexes(Qt::CaseSensitivity nameCaseSensitivity)
{
    QList<StyleRule> universals;
    for (int i = 0; i < styleRules.size(); ++i) {
        const StyleRule &rule = styleRules.at(i);
        QList<Selector> universalsSelectors;
        for (int j = 0; j < rule.selectors.size(); ++j) {
            const Selector& selector = rule.selectors.at(j);

            if (selector.basicSelectors.isEmpty())
                continue;

            if (selector.basicSelectors.at(0).relationToNext == BasicSelector::NoRelation) {
                if (selector.basicSelectors.size() != 1)
                    continue;
            } else if (selector.basicSelectors.size() <= 1) {
                continue;
            }

            const BasicSelector &sel = selector.basicSelectors.at(selector.basicSelectors.size() - 1);

            if (!sel.ids.isEmpty()) {
                StyleRule nr;
                nr.selectors += selector;
                nr.declarations = rule.declarations;
                nr.order = i;
                idIndex.insert(sel.ids.at(0), nr);
            } else if (!sel.elementName.isEmpty()) {
                StyleRule nr;
                nr.selectors += selector;
                nr.declarations = rule.declarations;
                nr.order = i;
                QString name = sel.elementName;
                if (nameCaseSensitivity == Qt::CaseInsensitive)
                    name = std::move(name).toLower();
                nameIndex.insert(name, nr);
            } else {
                universalsSelectors += selector;
            }
        }
        if (!universalsSelectors.isEmpty()) {
            StyleRule nr;
            nr.selectors = universalsSelectors;
            nr.declarations = rule.declarations;
            nr.order = i;
            universals << nr;
        }
    }
    styleRules = universals;
}